

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cc
# Opt level: O0

void bsp_qsize(bsp_size_t *nmessages,bsp_size_t *accum_nbytes)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  size_t sVar4;
  size_t bsp_size_max;
  bsp_size_t *accum_nbytes_local;
  bsp_size_t *nmessages_local;
  
  if ((s_spmd == (Spmd *)0x0) || (bVar1 = bsplib::Spmd::closed(s_spmd), bVar1)) {
    bsp_abort("bsp_qsize: can only be called within SPMD section\n");
  }
  if ((nmessages == (bsp_size_t *)0x0) || (accum_nbytes == (bsp_size_t *)0x0)) {
    bsp_abort("bsp_qsize: both arguments may not be NULL\n");
  }
  iVar2 = std::numeric_limits<int>::max();
  uVar3 = (ulong)iVar2;
  sVar4 = bsplib::Bsmp::n_total_messages(s_bsmp);
  if (uVar3 < sVar4) {
    sVar4 = bsplib::Bsmp::n_total_messages(s_bsmp);
    bsp_abort("bsp_qsize: Integer overflow while querying number of messages in queue. There are %zu messages while the data type allows only %zu\n"
              ,sVar4,uVar3);
  }
  sVar4 = bsplib::Bsmp::total_payload(s_bsmp);
  if (uVar3 < sVar4) {
    sVar4 = bsplib::Bsmp::total_payload(s_bsmp);
    bsp_abort("bsp_qsize: Integer overflow while querying total amount of payload in queue. The total payload size is %zu  while the data type allows only %zu\n"
              ,sVar4,uVar3);
  }
  sVar4 = bsplib::Bsmp::n_total_messages(s_bsmp);
  *nmessages = (bsp_size_t)sVar4;
  sVar4 = bsplib::Bsmp::total_payload(s_bsmp);
  *accum_nbytes = (bsp_size_t)sVar4;
  return;
}

Assistant:

void bsp_qsize( bsp_size_t * nmessages, bsp_size_t * accum_nbytes )
{
    if (!s_spmd || s_spmd->closed())
        bsp_abort("bsp_qsize: can only be called within SPMD section\n");

    if ( nmessages == NULL || accum_nbytes == NULL )
        bsp_abort("bsp_qsize: both arguments may not be NULL\n");

    size_t bsp_size_max = std::numeric_limits<bsp_size_t>::max();
    if ( s_bsmp->n_total_messages() > bsp_size_max )
        bsp_abort("bsp_qsize: Integer overflow while querying number of "
                "messages in queue. There are %zu messages while the data"
                " type allows only %zu\n", s_bsmp->n_total_messages(),
                bsp_size_max );

   if ( s_bsmp->total_payload() > bsp_size_max )
        bsp_abort("bsp_qsize: Integer overflow while querying total amount of "
                "payload in queue. The total payload size is %zu  while the data"
                " type allows only %zu\n", s_bsmp->total_payload(),
                bsp_size_max );

   * nmessages = static_cast<bsp_size_t>( s_bsmp->n_total_messages() );
   * accum_nbytes = static_cast<bsp_size_t>( s_bsmp->total_payload() );
}